

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O0

CreditCard * __thiscall CreditCard::operator=(CreditCard *this,CreditCard *copy)

{
  CreditCard *copy_local;
  CreditCard *this_local;
  
  Transaction::operator=(&this->super_Transaction,&copy->super_Transaction);
  std::__cxx11::string::operator=((string *)&this->cardNumber,(string *)&copy->cardNumber);
  std::__cxx11::string::operator=((string *)&this->expirationDate,(string *)&copy->expirationDate);
  std::__cxx11::string::operator=((string *)&this->cvv,(string *)&copy->cvv);
  return this;
}

Assistant:

CreditCard& CreditCard::operator=(const CreditCard &copy){
    Transaction::operator=(copy);
    cardNumber = copy.cardNumber;
    expirationDate = copy.expirationDate;
    cvv = copy.cvv;
    return *this;
}